

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_multiclasstask.cc
# Opt level: O1

void MulticlassTask::initialize(search *sch,size_t *num_actions,options_i *param_3)

{
  size_t sVar1;
  double dVar2;
  size_t *psVar3;
  undefined1 auVar4 [16];
  uint local_28 [2];
  
  psVar3 = (size_t *)operator_new(0x30);
  *psVar3 = 0;
  psVar3[1] = 0;
  psVar3[2] = 0;
  psVar3[3] = 0;
  psVar3[4] = 0;
  psVar3[5] = 0;
  Search::search::set_options(sch,0);
  Search::search::set_num_learners(sch,*num_actions);
  sVar1 = *num_actions;
  auVar4._8_4_ = (int)(sVar1 >> 0x20);
  auVar4._0_8_ = sVar1;
  auVar4._12_4_ = 0x45300000;
  *psVar3 = sVar1;
  dVar2 = log((auVar4._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0));
  dVar2 = ceil(dVar2 / 0.6931471805599453);
  psVar3[1] = (long)(dVar2 - 9.223372036854776e+18) & (long)dVar2 >> 0x3f | (long)dVar2;
  local_28[1] = 1;
  v_array<unsigned_int>::push_back((v_array<unsigned_int> *)(psVar3 + 2),local_28 + 1);
  local_28[0] = 2;
  v_array<unsigned_int>::push_back((v_array<unsigned_int> *)(psVar3 + 2),local_28);
  sch->task_data = psVar3;
  return;
}

Assistant:

void initialize(Search::search& sch, size_t& num_actions, VW::config::options_i& /*vm*/)
{
  task_data* my_task_data = new task_data();
  sch.set_options(0);
  sch.set_num_learners(num_actions);
  my_task_data->max_label = num_actions;
  my_task_data->num_level = (size_t)ceil(log(num_actions) / log(2));
  my_task_data->y_allowed.push_back(1);
  my_task_data->y_allowed.push_back(2);
  sch.set_task_data(my_task_data);
}